

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_game.cxx
# Opt level: O2

bool __thiscall xray_re::xr_level_game::save(xr_level_game *this,char *path,char *name)

{
  xr_file_system *this_00;
  xr_writer *w;
  
  this_00 = xr_file_system::instance();
  w = xr_file_system::w_open(this_00,path,name);
  if (w != (xr_writer *)0x0) {
    save(this,w);
    (*w->_vptr_xr_writer[1])(w);
  }
  return w != (xr_writer *)0x0;
}

Assistant:

bool xr_level_game::save(const char* path, const char* name) const
{
	xr_file_system& fs = xr_file_system::instance();
	xr_writer* w = fs.w_open(path, name);
	if (w == 0)
		return false;
	save(*w);
	fs.w_close(w);
	return true;
}